

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprGlobalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  int iVar1;
  Fts3Expr *in_RDX;
  undefined4 in_ESI;
  MatchInfo *p;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = sqlite3Fts3EvalPhraseStats
                    ((Fts3Cursor *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,(u32 *)in_RDX);
  return iVar1;
}

Assistant:

static int fts3ExprGlobalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number (numbered from zero) */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  MatchInfo *p = (MatchInfo *)pCtx;
  return sqlite3Fts3EvalPhraseStats(
      p->pCursor, pExpr, &p->aMatchinfo[3*iPhrase*p->nCol]
  );
}